

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

void __thiscall QSqlRelationalTableModel::clear(QSqlRelationalTableModel *this)

{
  QSqlRelationalTableModelPrivate *this_00;
  QSqlRelationalTableModelPrivate *d;
  
  this_00 = d_func((QSqlRelationalTableModel *)0x15b36b);
  QSqlQueryModel::beginResetModel((QSqlQueryModel *)this_00);
  QSqlRelationalTableModelPrivate::clearChanges(this_00);
  QList<QSharedPointer<QRelation>_>::clear((QList<QSharedPointer<QRelation>_> *)this_00);
  QSqlTableModel::clear((QSqlTableModel *)this_00);
  QSqlQueryModel::endResetModel((QSqlQueryModel *)this_00);
  return;
}

Assistant:

void QSqlRelationalTableModel::clear()
{
    Q_D(QSqlRelationalTableModel);
    beginResetModel();
    d->clearChanges();
    d->relations.clear();
    QSqlTableModel::clear();
    endResetModel();
}